

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

int __thiscall
QUnsortedModelEngine::buildIndices
          (QUnsortedModelEngine *this,QString *str,QModelIndex *parent,int n,QIndexMapper *indices,
          QMatchData *m)

{
  QList<int> *this_00;
  Int IVar1;
  int *piVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  CaseSensitivity CVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  int local_cc;
  int local_c4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  this_00 = &(m->indices).vector;
  uVar11 = 0;
  local_c4 = 0;
  do {
    iVar6 = (int)uVar11;
    if (indices->v == true) {
      if (((long)(int)(indices->vector).d.size <= (long)uVar11) || (local_c4 == n)) {
        local_cc = (indices->vector).d.ptr[(uVar11 & 0xffffffff) - 1];
        goto LAB_0064a578;
      }
      iVar5 = (indices->vector).d.ptr[uVar11];
    }
    else {
      iVar5 = indices->f;
      if (((long)((indices->t - iVar5) + 1) <= (long)uVar11) || (local_c4 == n)) {
        local_cc = iVar5 + iVar6 + -1;
LAB_0064a578:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return local_cc;
      }
      iVar5 = iVar5 + iVar6;
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    (**(code **)(*plVar7 + 0x60))
              (&local_78,plVar7,iVar5,((this->super_QCompletionEngine).c)->column,parent);
    uVar8 = (**(code **)(*plVar7 + 0x138))(plVar7,&local_78);
    if ((uVar8 & 1) != 0) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = 0xaaaaaaaa;
      uStack_94 = 0xaaaaaaaa;
      uStack_90 = 0xaaaaaaaa;
      uStack_8c = 0xaaaaaaaa;
      (**(code **)(*plVar7 + 0x90))
                (&local_58,plVar7,&local_78,((this->super_QCompletionEngine).c)->role);
      ::QVariant::toString();
      ::QVariant::~QVariant((QVariant *)&local_58);
      IVar1 = (((this->super_QCompletionEngine).c)->filterMode).
              super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i;
      CVar10 = (CaseSensitivity)str;
      if (IVar1 == 1) {
        lVar9 = QString::indexOf((QString *)&local_98,(longlong)str,CaseInsensitive);
        if (lVar9 != -1) goto LAB_0064a47e;
        bVar3 = false;
      }
      else {
        if (IVar1 == 3) {
          cVar4 = QString::endsWith((QString *)&local_98,CVar10);
        }
        else {
          if (IVar1 != 2) goto LAB_0064a47e;
          cVar4 = QString::startsWith((QString *)&local_98,CVar10);
        }
        bVar3 = false;
        if (cVar4 != '\0') {
LAB_0064a47e:
          if (indices->v == true) {
            local_58._0_4_ = (indices->vector).d.ptr[uVar11];
          }
          else {
            local_58._0_4_ = indices->f + iVar6;
          }
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)this_00,(m->indices).vector.d.size,(int *)local_58.data);
          QList<int>::end(this_00);
          local_c4 = local_c4 + 1;
          bVar3 = false;
          if ((m->exactMatchIndex == -1) &&
             (iVar5 = QString::compare((QString *)&local_98,CVar10), bVar3 = false, iVar5 == 0)) {
            if (indices->v == true) {
              iVar6 = (indices->vector).d.ptr[uVar11];
            }
            else {
              iVar6 = indices->f + iVar6;
            }
            m->exactMatchIndex = iVar6;
            bVar3 = n == -1;
            if (n == -1) {
              local_cc = iVar6;
            }
          }
        }
      }
      piVar2 = (int *)CONCAT44(uStack_94,local_98);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
        }
      }
      if (bVar3) goto LAB_0064a578;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int QUnsortedModelEngine::buildIndices(const QString& str, const QModelIndex& parent, int n,
                                      const QIndexMapper& indices, QMatchData* m)
{
    Q_ASSERT(m->partial);
    Q_ASSERT(n != -1 || m->exactMatchIndex == -1);
    const QAbstractItemModel *model = c->proxy->sourceModel();
    int i, count = 0;

    for (i = 0; i < indices.count() && count != n; ++i) {
        QModelIndex idx = model->index(indices[i], c->column, parent);

        if (!(model->flags(idx) & Qt::ItemIsSelectable))
            continue;

        QString data = model->data(idx, c->role).toString();

        switch (c->filterMode) {
        case Qt::MatchStartsWith:
            if (!data.startsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchContains:
            if (!data.contains(str, c->cs))
                continue;
            break;
        case Qt::MatchEndsWith:
            if (!data.endsWith(str, c->cs))
                continue;
            break;
        case Qt::MatchExactly:
        case Qt::MatchFixedString:
        case Qt::MatchCaseSensitive:
        case Qt::MatchRegularExpression:
        case Qt::MatchWildcard:
        case Qt::MatchWrap:
        case Qt::MatchRecursive:
            Q_UNREACHABLE();
            break;
        }
        m->indices.append(indices[i]);
        ++count;
        if (m->exactMatchIndex == -1 && QString::compare(data, str, c->cs) == 0) {
            m->exactMatchIndex = indices[i];
            if (n == -1)
                return indices[i];
        }
    }
    return indices[i-1];
}